

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O0

void Abc_SclDnsizePrint(SC_Man *p,int Iter,int nAttempts,int nOverlaps,int nChanges,int fVerbose)

{
  abctime aVar1;
  undefined8 uVar2;
  int fVerbose_local;
  int nChanges_local;
  int nOverlaps_local;
  int nAttempts_local;
  int Iter_local;
  SC_Man *p_local;
  
  if (Iter == -1) {
    printf("Total : ");
  }
  else {
    printf("%5d : ",(ulong)(uint)Iter);
  }
  printf("Try =%6d  ",(ulong)(uint)nAttempts);
  printf("Over =%6d  ",(ulong)(uint)nOverlaps);
  printf("Fail =%6d  ",(ulong)(uint)((nAttempts - nOverlaps) - nChanges));
  printf("Win =%6d  ",(ulong)(uint)nChanges);
  printf("A: ");
  printf("%.2f ",(double)p->SumArea);
  printf("(%+5.1f %%)  ",((double)(p->SumArea - p->SumArea0) * 100.0) / (double)p->SumArea0);
  printf("D: ");
  printf("%.2f ps ",(double)p->MaxDelay);
  printf("(%+5.1f %%)  ",((double)(p->MaxDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  aVar1 = Abc_Clock();
  printf("%8.2f sec    ",((double)(aVar1 - p->timeTotal) * 1.0) / 1000000.0);
  uVar2 = 0xd;
  if (fVerbose != 0) {
    uVar2 = 10;
  }
  printf("%c",uVar2);
  return;
}

Assistant:

void Abc_SclDnsizePrint( SC_Man * p, int Iter, int nAttempts, int nOverlaps, int nChanges, int fVerbose )
{
    if ( Iter == -1 )
        printf( "Total : " );
    else
        printf( "%5d : ",    Iter );
    printf( "Try =%6d  ",    nAttempts );
    printf( "Over =%6d  ",   nOverlaps );
    printf( "Fail =%6d  ",   nAttempts-nOverlaps-nChanges );
    printf( "Win =%6d  ",    nChanges );
    printf( "A: " );
    printf( "%.2f ",         p->SumArea );
    printf( "(%+5.1f %%)  ", 100.0 * (p->SumArea - p->SumArea0)/ p->SumArea0 );
    printf( "D: " );
    printf( "%.2f ps ",      p->MaxDelay );
    printf( "(%+5.1f %%)  ", 100.0 * (p->MaxDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "%8.2f sec    ", 1.0*(Abc_Clock() - p->timeTotal)/(CLOCKS_PER_SEC) );
    printf( "%c", fVerbose ? '\n' : '\r' );
}